

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::bootstrap::ptr_assign<chaiscript::dispatch::Proxy_Function_Base>
          (bootstrap *this,Boxed_Value *lhs,
          shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *rhs)

{
  uint uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  undefined8 *puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> _Var6;
  Boxed_Value BVar7;
  uint *local_68;
  undefined8 local_60;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Type_Info local_48;
  Boxed_Value local_30;
  
  peVar2 = (lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 1) == 0) {
      local_48.m_type_info = (type_info *)&chaiscript::dispatch::Proxy_Function_Base::typeinfo;
      local_48.m_bare_type_info = (type_info *)&chaiscript::dispatch::Proxy_Function_Base::typeinfo;
      local_48.m_flags = 0;
      bVar4 = Type_Info::bare_equal(&peVar2->m_type_info,&local_48);
      if (bVar4) goto LAB_00200d55;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x48);
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"type mismatch in pointer assignment","");
    *puVar5 = &PTR__bad_boxed_cast_0030d5e8;
    puVar5[1] = 0;
    puVar5[2] = 0;
    *(undefined4 *)(puVar5 + 3) = 0x20;
    puVar5[4] = 0;
    puVar5[5] = puVar5 + 7;
    if (local_68 == &local_58) {
      *(uint *)(puVar5 + 7) = local_58;
      *(undefined4 *)((long)puVar5 + 0x3c) = uStack_54;
      *(undefined4 *)(puVar5 + 8) = uStack_50;
      *(undefined4 *)((long)puVar5 + 0x44) = uStack_4c;
    }
    else {
      puVar5[5] = local_68;
      puVar5[7] = CONCAT44(uStack_54,local_58);
    }
    puVar5[6] = local_60;
    local_60 = 0;
    local_58 = local_58 & 0xffffff00;
    local_68 = &local_58;
    __cxa_throw(puVar5,&exception::bad_boxed_cast::typeinfo,
                exception::bad_boxed_cast::~bad_boxed_cast);
  }
LAB_00200d55:
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base>
            ((Object_Data *)&local_48,rhs,false);
  _Var6 = (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>)
          Boxed_Value::assign(&local_30,lhs);
  if (local_30.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var6._M_refcount._M_pi = extraout_RDX._M_pi;
    _Var6._M_ptr = extraout_RAX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_bare_type_info);
    _Var6._M_refcount._M_pi = extraout_RDX_00._M_pi;
    _Var6._M_ptr = extraout_RAX_00;
  }
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = _Var6._M_refcount._M_pi;
  peVar2 = (lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (lhs->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
  (lhs->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value ptr_assign(Boxed_Value lhs, const std::shared_ptr<Type> &rhs)
    {
      if (lhs.is_undef() 
          || (!lhs.get_type_info().is_const() && lhs.get_type_info().bare_equal(chaiscript::detail::Get_Type_Info<Type>::get())))
      {
        lhs.assign(Boxed_Value(rhs));
        return lhs;
      } else {
        throw exception::bad_boxed_cast("type mismatch in pointer assignment");
      }
    }